

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype __thiscall
QtPrivate::lastIndexOf
          (QtPrivate *this,QStringView viewHaystack,QString *stringHaystack,QRegularExpression *re,
          qsizetype from,QRegularExpressionMatch *rmatch)

{
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> QVar1;
  bool bVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QStringView subjectView;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator iterator;
  QRegularExpressionMatch local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QRegularExpression::isValid((QRegularExpression *)stringHaystack);
  if (bVar2) {
    local_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    if (viewHaystack.m_data == (storage_type_conflict *)0x0) {
      subjectView.m_data = (storage_type_conflict *)this;
      subjectView.m_size = (qsizetype)stringHaystack;
      QRegularExpression::globalMatchView
                ((QRegularExpression *)&local_50,subjectView,viewHaystack.m_size,NormalMatch,
                 (MatchOptions)0x0);
    }
    else {
      QRegularExpression::globalMatch
                ((QRegularExpression *)&local_50,stringHaystack,(qsizetype)viewHaystack.m_data,
                 NormalMatch,(MatchOptions)0x0);
    }
    qVar4 = -1;
    while( true ) {
      bVar2 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_50)
      ;
      if (!bVar2) break;
      local_58.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_58);
      qVar3 = QRegularExpressionMatch::capturedStart(&local_58,0);
      if ((long)((long)&(re->d).d.ptr + ((long)re >> 0x3f & (ulong)this)) < qVar3) {
        QRegularExpressionMatch::~QRegularExpressionMatch(&local_58);
        break;
      }
      if (from != 0) {
        QVar1.d.ptr = *(totally_ordered_wrapper<QRegularExpressionMatchPrivate_*> *)from;
        *(QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)from = local_58.d.d.ptr;
        local_58.d.d.ptr =
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)QVar1.d.ptr;
      }
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_58);
      qVar4 = qVar3;
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)&local_50);
  }
  else {
    QRegularExpression::pattern(&local_50,(QRegularExpression *)stringHaystack);
    qtWarnAboutInvalidRegularExpression(&local_50,"QString(View)::lastIndexOf");
    lastIndexOf((QtPrivate *)&local_50);
    qVar4 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar4;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView viewHaystack, const QString *stringHaystack, const QRegularExpression &re, qsizetype from, QRegularExpressionMatch *rmatch)
{
    if (!re.isValid()) {
        qtWarnAboutInvalidRegularExpression(re.pattern(), "QString(View)::lastIndexOf");
        return -1;
    }

    qsizetype endpos = (from < 0) ? (viewHaystack.size() + from + 1) : (from + 1);
    QRegularExpressionMatchIterator iterator = stringHaystack
            ? re.globalMatch(*stringHaystack)
            : re.globalMatchView(viewHaystack);
    qsizetype lastIndex = -1;
    while (iterator.hasNext()) {
        QRegularExpressionMatch match = iterator.next();
        qsizetype start = match.capturedStart();
        if (start < endpos) {
            lastIndex = start;
            if (rmatch)
                *rmatch = std::move(match);
        } else {
            break;
        }
    }

    return lastIndex;
}